

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_digest.c
# Opt level: O0

void * GostR3411_2012_256_digest_newctx(void *provctx)

{
  GOST_CTX_conflict *pGVar1;
  GOST_digest *in_stack_00000008;
  void *in_stack_00000010;
  
  pGVar1 = digest_newctx(in_stack_00000010,in_stack_00000008,(OSSL_PARAM *)provctx);
  return pGVar1;
}

Assistant:

static GOST_CTX *digest_newctx(void *provctx, GOST_digest *descriptor,
                               const OSSL_PARAM *known_params)
{
    GOST_CTX *gctx = NULL;

    if ((gctx = OPENSSL_zalloc(sizeof(*gctx))) != NULL) {
        gctx->provctx = provctx;
        gctx->known_params = known_params;
        gctx->descriptor = descriptor;
        gctx->digest = GOST_init_digest(descriptor);
        gctx->dctx = EVP_MD_CTX_new();

        if (gctx->digest == NULL || gctx->dctx == NULL) {
            digest_freectx(gctx);
            gctx = NULL;
        }
    }
    return gctx;
}